

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

void __thiscall
mir::inst::MirFunction::MirFunction
          (MirFunction *this,string *_name,shared_ptr<mir::types::FunctionTy> *_type)

{
  string *in_RSI;
  Displayable *in_RDI;
  shared_ptr<mir::types::FunctionTy> *in_stack_ffffffffffffffb8;
  
  prelude::Displayable::Displayable(in_RDI);
  in_RDI->_vptr_Displayable = (_func_int **)&PTR_display_003704d0;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  std::shared_ptr<mir::types::FunctionTy>::shared_ptr
            ((shared_ptr<mir::types::FunctionTy> *)in_RSI,in_stack_ffffffffffffffb8);
  memset(in_RDI + 7,0,0x30);
  std::
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  ::map((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
         *)0x263114);
  memset(in_RDI + 0xd,0,0x30);
  std::
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  ::map((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         *)0x263138);
  return;
}

Assistant:

MirFunction(std::string _name, std::shared_ptr<types::FunctionTy> _type)
      : name(_name), type(_type), basic_blks(), variables() {}